

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void * gtemplate_donew(t_symbol *sym,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _gtemplate *p_Var3;
  undefined8 uVar4;
  int iVar5;
  _gtemplate *owner;
  t_template *ptVar6;
  _glist *p_Var7;
  t_atom *ptVar8;
  _gtemplate *p_Var9;
  t_template *x2;
  long lVar10;
  
  owner = (_gtemplate *)pd_new(gtemplate_class);
  ptVar6 = (t_template *)pd_findbyclass(sym,template_class);
  gensym("x");
  p_Var7 = canvas_getcurrent();
  owner->x_owner = p_Var7;
  owner->x_next = (_gtemplate *)0x0;
  owner->x_sym = sym;
  owner->x_argc = argc;
  ptVar8 = (t_atom *)getbytes((long)argc << 4);
  owner->x_argv = ptVar8;
  if (0 < argc) {
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&argv->a_type + lVar10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&owner->x_argv->a_type + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar10);
  }
  if (ptVar6 == (t_template *)0x0) {
    ptVar6 = template_new(sym,argc,argv);
    owner->x_template = ptVar6;
    ptVar6->t_list = owner;
  }
  else {
    owner->x_template = ptVar6;
    p_Var3 = ptVar6->t_list;
    if (ptVar6->t_list == (_gtemplate *)0x0) {
      x2 = template_new(&s_,argc,argv);
      canvas_redrawallfortemplate(ptVar6,2);
      iVar5 = template_match(ptVar6,x2);
      if (iVar5 == 0) {
        template_conform(ptVar6,x2);
        pd_free((t_pd *)ptVar6);
        ptVar6 = template_new(sym,argc,argv);
        owner->x_template = ptVar6;
      }
      pd_free(&x2->t_pdobj);
      ptVar6->t_list = owner;
      canvas_redrawallfortemplate(ptVar6,1);
    }
    else {
      do {
        p_Var9 = p_Var3;
        p_Var3 = p_Var9->x_next;
      } while (p_Var3 != (_gtemplate *)0x0);
      p_Var9->x_next = owner;
      post("template %s: warning: already exists.");
    }
  }
  outlet_new((t_object *)owner,(t_symbol *)0x0);
  return owner;
}

Assistant:

static void *gtemplate_donew(t_symbol *sym, int argc, t_atom *argv)
{
    t_gtemplate *x = (t_gtemplate *)pd_new(gtemplate_class);
    t_template *t = template_findbyname(sym);
    int i;
    t_symbol *sx = gensym("x");
    x->x_owner = canvas_getcurrent();
    x->x_next = 0;
    x->x_sym = sym;
    x->x_argc = argc;
    x->x_argv = (t_atom *)getbytes(argc * sizeof(t_atom));
    for (i = 0; i < argc; i++)
        x->x_argv[i] = argv[i];

        /* already have a template by this name? */
    if (t)
    {
        x->x_template = t;
            /* if it's already got a "struct" object we
            just tack this one to the end of the list and leave it
            there. */
        if (t->t_list)
        {
            t_gtemplate *x2, *x3;
            for (x2 = x->x_template->t_list; (x3 = x2->x_next); x2 = x3)
                ;
            x2->x_next = x;
            post("template %s: warning: already exists.", sym->s_name);
        }
        else
        {
                /* if there's none, we just replace the template with
                our own and conform it. */
            t_template *y = template_new(&s_, argc, argv);
            canvas_redrawallfortemplate(t, 2);
                /* Unless the new template is different from the old one,
                there's nothing to do.  */
            if (!template_match(t, y))
            {
                    /* conform everyone to the new template */
                template_conform(t, y);
                pd_free(&t->t_pdobj);
                x->x_template = t = template_new(sym, argc, argv);
            }
            pd_free(&y->t_pdobj);
            t->t_list = x;
            canvas_redrawallfortemplate(t, 1);
        }
    }
    else
    {
            /* otherwise make a new one and we're the only struct on it. */
        x->x_template = t = template_new(sym, argc, argv);
        t->t_list = x;
    }
    outlet_new(&x->x_obj, 0);
    return (x);
}